

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_casx_asi(DisasContext_conflict8 *dc,TCGv_i32 addr,TCGv_i32 cmpv,int insn,int rd)

{
  int iVar1;
  TCGContext_conflict8 *s;
  TCGContext_conflict8 *pTVar2;
  TCGTemp *pTVar3;
  TCGTemp *a1;
  TCGv_i64 newv;
  uintptr_t o_1;
  TCGv_i64 retv;
  DisasASI DVar4;
  
  s = dc->uc->tcg_ctx;
  DVar4 = get_asi(dc,insn,MO_BEQ);
  if (DVar4.type == GET_ASI_EXCP) {
    return;
  }
  if (DVar4.type == GET_ASI_DIRECT) {
    pTVar3 = tcg_temp_new_internal_sparc64(s,TCG_TYPE_I64,false);
    pTVar2 = dc->uc->tcg_ctx;
    if (rd < 1) {
      if (4 < (uint)dc->n_ttl) {
        __assert_fail("dc->n_ttl < ARRAY_SIZE(dc->ttl)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                      ,0x7c,"TCGv_i64 get_temp_tl(DisasContext *)");
      }
      a1 = tcg_temp_new_internal_sparc64(pTVar2,TCG_TYPE_I64,false);
      newv = (TCGv_i64)((long)a1 - (long)pTVar2);
      iVar1 = dc->n_ttl;
      dc->n_ttl = iVar1 + 1;
      dc->ttl[iVar1] = (TCGv_i32)newv;
      tcg_gen_op2_sparc64(pTVar2,INDEX_op_movi_i64,(TCGArg)a1,0);
    }
    else {
      if (0x1f < rd) {
        __assert_fail("reg < 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                      ,0x12a,"TCGv_i64 gen_load_gpr(DisasContext *, int)");
      }
      newv = pTVar2->cpu_regs[(uint)rd];
    }
    retv = (TCGv_i64)((long)pTVar3 - (long)s);
    tcg_gen_atomic_cmpxchg_i64_sparc64
              (s,retv,(TCGv_i64)addr,(TCGv_i64)cmpv,newv,(long)DVar4.mem_idx,DVar4.memop);
    if (0 < rd) {
      if (0x1f < rd) {
        __assert_fail("reg < 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                      ,0x137,"void gen_store_gpr(DisasContext *, int, TCGv_i64)");
      }
      pTVar2 = dc->uc->tcg_ctx;
      if (pTVar2->cpu_regs[(uint)rd] != retv) {
        tcg_gen_op2_sparc64(pTVar2,INDEX_op_mov_i64,
                            (TCGArg)(pTVar2->cpu_regs[(uint)rd] + (long)pTVar2),
                            (TCGArg)((long)pTVar2 + (long)retv));
      }
    }
    tcg_temp_free_internal_sparc64(s,(TCGTemp *)(retv + (long)s));
    return;
  }
  gen_exception(dc,0x32);
  return;
}

Assistant:

static void gen_casx_asi(DisasContext *dc, TCGv addr, TCGv cmpv,
                         int insn, int rd)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    DisasASI da = get_asi(dc, insn, MO_TEQ);
    TCGv oldv;

    switch (da.type) {
    case GET_ASI_EXCP:
        return;
    case GET_ASI_DIRECT:
        oldv = tcg_temp_new(tcg_ctx);
        tcg_gen_atomic_cmpxchg_tl(tcg_ctx, oldv, addr, cmpv, gen_load_gpr(dc, rd),
                                  da.mem_idx, da.memop);
        gen_store_gpr(dc, rd, oldv);
        tcg_temp_free(tcg_ctx, oldv);
        break;
    default:
        /* ??? Should be DAE_invalid_asi.  */
        gen_exception(dc, TT_DATA_ACCESS);
        break;
    }
}